

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_opt.c
# Opt level: O1

int tnt_opt_set(tnt_opt *opt,tnt_opt_type name,__va_list_tag *args)

{
  uint uVar1;
  __time_t _Var2;
  int iVar3;
  undefined8 *puVar4;
  long *plVar5;
  int *piVar6;
  char *p;
  
  iVar3 = 1;
  switch(name) {
  case TNT_OPT_URI:
    if (opt->uristr != (char *)0x0) {
      tnt_mem_free(opt->uristr);
    }
    uVar1 = args->gp_offset;
    if ((ulong)uVar1 < 0x29) {
      puVar4 = (undefined8 *)((ulong)uVar1 + (long)args->reg_save_area);
      args->gp_offset = uVar1 + 8;
    }
    else {
      puVar4 = (undefined8 *)args->overflow_arg_area;
      args->overflow_arg_area = puVar4 + 1;
    }
    p = tnt_mem_dup((char *)*puVar4);
    opt->uristr = p;
    if (p == (char *)0x0) {
      return 2;
    }
    iVar3 = uri_parse(opt->uri,p);
    if (iVar3 == -1) {
      return 1;
    }
    break;
  case TNT_OPT_TMOUT_CONNECT:
    uVar1 = args->gp_offset;
    if ((ulong)uVar1 < 0x29) {
      plVar5 = (long *)((ulong)uVar1 + (long)args->reg_save_area);
      args->gp_offset = uVar1 + 8;
    }
    else {
      plVar5 = (long *)args->overflow_arg_area;
      args->overflow_arg_area = plVar5 + 1;
    }
    _Var2 = ((__time_t *)*plVar5)[1];
    (opt->tmout_connect).tv_sec = *(__time_t *)*plVar5;
    (opt->tmout_connect).tv_usec = _Var2;
    break;
  case TNT_OPT_TMOUT_RECV:
    uVar1 = args->gp_offset;
    if ((ulong)uVar1 < 0x29) {
      plVar5 = (long *)((ulong)uVar1 + (long)args->reg_save_area);
      args->gp_offset = uVar1 + 8;
    }
    else {
      plVar5 = (long *)args->overflow_arg_area;
      args->overflow_arg_area = plVar5 + 1;
    }
    _Var2 = ((__time_t *)*plVar5)[1];
    (opt->tmout_recv).tv_sec = *(__time_t *)*plVar5;
    (opt->tmout_recv).tv_usec = _Var2;
    break;
  case TNT_OPT_TMOUT_SEND:
    uVar1 = args->gp_offset;
    if ((ulong)uVar1 < 0x29) {
      plVar5 = (long *)((ulong)uVar1 + (long)args->reg_save_area);
      args->gp_offset = uVar1 + 8;
    }
    else {
      plVar5 = (long *)args->overflow_arg_area;
      args->overflow_arg_area = plVar5 + 1;
    }
    _Var2 = ((__time_t *)*plVar5)[1];
    (opt->tmout_send).tv_sec = *(__time_t *)*plVar5;
    (opt->tmout_send).tv_usec = _Var2;
    break;
  case TNT_OPT_SEND_CB:
    uVar1 = args->gp_offset;
    if ((ulong)uVar1 < 0x29) {
      puVar4 = (undefined8 *)((ulong)uVar1 + (long)args->reg_save_area);
      args->gp_offset = uVar1 + 8;
    }
    else {
      puVar4 = (undefined8 *)args->overflow_arg_area;
      args->overflow_arg_area = puVar4 + 1;
    }
    opt->send_cb = (void *)*puVar4;
    break;
  case TNT_OPT_SEND_CBV:
    uVar1 = args->gp_offset;
    if ((ulong)uVar1 < 0x29) {
      puVar4 = (undefined8 *)((ulong)uVar1 + (long)args->reg_save_area);
      args->gp_offset = uVar1 + 8;
    }
    else {
      puVar4 = (undefined8 *)args->overflow_arg_area;
      args->overflow_arg_area = puVar4 + 1;
    }
    opt->send_cbv = (void *)*puVar4;
    break;
  case TNT_OPT_SEND_CB_ARG:
    uVar1 = args->gp_offset;
    if ((ulong)uVar1 < 0x29) {
      puVar4 = (undefined8 *)((ulong)uVar1 + (long)args->reg_save_area);
      args->gp_offset = uVar1 + 8;
    }
    else {
      puVar4 = (undefined8 *)args->overflow_arg_area;
      args->overflow_arg_area = puVar4 + 1;
    }
    opt->send_cb_arg = (void *)*puVar4;
    break;
  case TNT_OPT_SEND_BUF:
    uVar1 = args->gp_offset;
    if ((ulong)uVar1 < 0x29) {
      piVar6 = (int *)((ulong)uVar1 + (long)args->reg_save_area);
      args->gp_offset = uVar1 + 8;
    }
    else {
      piVar6 = (int *)args->overflow_arg_area;
      args->overflow_arg_area = piVar6 + 2;
    }
    opt->send_buf = *piVar6;
    break;
  case TNT_OPT_RECV_CB:
    uVar1 = args->gp_offset;
    if ((ulong)uVar1 < 0x29) {
      puVar4 = (undefined8 *)((ulong)uVar1 + (long)args->reg_save_area);
      args->gp_offset = uVar1 + 8;
    }
    else {
      puVar4 = (undefined8 *)args->overflow_arg_area;
      args->overflow_arg_area = puVar4 + 1;
    }
    opt->recv_cb = (void *)*puVar4;
    break;
  case TNT_OPT_RECV_CB_ARG:
    uVar1 = args->gp_offset;
    if ((ulong)uVar1 < 0x29) {
      puVar4 = (undefined8 *)((ulong)uVar1 + (long)args->reg_save_area);
      args->gp_offset = uVar1 + 8;
    }
    else {
      puVar4 = (undefined8 *)args->overflow_arg_area;
      args->overflow_arg_area = puVar4 + 1;
    }
    opt->recv_cb_arg = (void *)*puVar4;
    break;
  case TNT_OPT_RECV_BUF:
    uVar1 = args->gp_offset;
    if ((ulong)uVar1 < 0x29) {
      piVar6 = (int *)((ulong)uVar1 + (long)args->reg_save_area);
      args->gp_offset = uVar1 + 8;
    }
    else {
      piVar6 = (int *)args->overflow_arg_area;
      args->overflow_arg_area = piVar6 + 2;
    }
    opt->recv_buf = *piVar6;
    break;
  default:
    goto switchD_001092ff_default;
  }
  iVar3 = 0;
switchD_001092ff_default:
  return iVar3;
}

Assistant:

int
tnt_opt_set(struct tnt_opt *opt, enum tnt_opt_type name, va_list args)
{
	struct timeval *tvp;
	switch (name) {
	case TNT_OPT_URI:
		if (opt->uristr) tnt_mem_free((void *)opt->uristr);
		opt->uristr = tnt_mem_dup(va_arg(args, char*));
		if (opt->uristr == NULL)
			return TNT_EMEMORY;
		if (uri_parse(opt->uri, opt->uristr) == -1)
			return TNT_EFAIL;
		break;
	case TNT_OPT_TMOUT_CONNECT:
		tvp = va_arg(args, struct timeval*);
		memcpy(&opt->tmout_connect, tvp, sizeof(struct timeval));
		break;
	case TNT_OPT_TMOUT_RECV:
		tvp = va_arg(args, struct timeval*);
		memcpy(&opt->tmout_recv, tvp, sizeof(struct timeval));
		break;
	case TNT_OPT_TMOUT_SEND:
		tvp = va_arg(args, struct timeval*);
		memcpy(&opt->tmout_send, tvp, sizeof(struct timeval));
		break;
	case TNT_OPT_SEND_CB:
		opt->send_cb = va_arg(args, void*);
		break;
	case TNT_OPT_SEND_CBV:
		opt->send_cbv = va_arg(args, void*);
		break;
	case TNT_OPT_SEND_CB_ARG:
		opt->send_cb_arg = va_arg(args, void*);
		break;
	case TNT_OPT_SEND_BUF:
		opt->send_buf = va_arg(args, int);
		break;
	case TNT_OPT_RECV_CB:
		opt->recv_cb = va_arg(args, void*);
		break;
	case TNT_OPT_RECV_CB_ARG:
		opt->recv_cb_arg = va_arg(args, void*);
		break;
	case TNT_OPT_RECV_BUF:
		opt->recv_buf = va_arg(args, int);
		break;
	default:
		return TNT_EFAIL;
	}
	return TNT_EOK;
}